

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandDetector.cpp
# Opt level: O0

void __thiscall HandDetector::getFingers(HandDetector *this)

{
  bool bVar1;
  undefined1 local_68 [8];
  ShortHand lastH;
  Hand *h;
  iterator __end1;
  iterator __begin1;
  vector<Hand,_std::allocator<Hand>_> *__range1;
  HandDetector *this_local;
  
  __end1 = std::vector<Hand,_std::allocator<Hand>_>::begin
                     ((vector<Hand,_std::allocator<Hand>_> *)this);
  h = (Hand *)std::vector<Hand,_std::allocator<Hand>_>::end
                        ((vector<Hand,_std::allocator<Hand>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Hand_*,_std::vector<Hand,_std::allocator<Hand>_>_>
                                *)&h);
    if (!bVar1) break;
    lastH._48_8_ = __gnu_cxx::__normal_iterator<Hand_*,_std::vector<Hand,_std::allocator<Hand>_>_>::
                   operator*(&__end1);
    Hand::getSame((ShortHand *)local_68,(Hand *)lastH._48_8_,
                  (vector<ShortHand,_std::allocator<ShortHand>_> *)(this + 0x100));
    Hand::getFingers((Hand *)lastH._48_8_,
                     (vector<ShortFinger,_std::allocator<ShortFinger>_> *)&lastH.filtersIndex);
    ShortHand::~ShortHand((ShortHand *)local_68);
    __gnu_cxx::__normal_iterator<Hand_*,_std::vector<Hand,_std::allocator<Hand>_>_>::operator++
              (&__end1);
  }
  checkHands(this);
  return;
}

Assistant:

void HandDetector::getFingers() {
    for (Hand &h : hands) {
        ShortHand lastH = h.getSame(lastHands);
        h.getFingers(lastH.fingers);
    }
    checkHands();
}